

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void NULLCMemory::read_into_bool_array(NULLCArray buffer,int offset,NULLCArray result)

{
  bool bVar1;
  int in_R9D;
  NULLCArray buffer_00;
  int offset_local;
  NULLCArray result_local;
  NULLCArray buffer_local;
  
  if (result.ptr == (char *)0x0) {
    nullcThrowError("buffer is empty");
  }
  else {
    buffer_00.ptr = (char *)(ulong)buffer.len;
    buffer_00.len = offset;
    bVar1 = check_access((NULLCMemory *)buffer.ptr,buffer_00,0,result.len,in_R9D);
    if (bVar1) {
      memcpy(result.ptr,(NULLCMemory *)buffer.ptr + offset,(ulong)result.len);
    }
  }
  return;
}

Assistant:

void read_into_bool_array(NULLCArray buffer, int offset, NULLCArray result)
	{
		if(!result.ptr)
		{
			nullcThrowError("buffer is empty");
			return;
		}

		if(!check_access(buffer, offset, 0, result.len))
			return;

		memcpy(result.ptr, buffer.ptr + offset, sizeof(bool) * result.len);
	}